

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMux.c
# Opt level: O1

If_Obj_t * Lpk_MapSuppRedDec_rec(Lpk_Man_t *p,uint *pTruth,int nVars,If_Obj_t **ppLeaves)

{
  int iVar1;
  void **ppvVar2;
  Lpk_Man_t *pLVar3;
  uint *pTruth_00;
  If_Obj_t **ppLeaves_00;
  uint uVar4;
  Kit_DsdNtk_t *pKVar5;
  Kit_DsdNtk_t *pKVar6;
  Kit_DsdNtk_t *pNtk;
  long lVar7;
  If_Obj_t *pIVar8;
  uint *puVar9;
  uint iVar_00;
  uint uVar10;
  uint *puVar11;
  int i_3;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint *puVar16;
  int i;
  uint uVar17;
  ulong uVar18;
  int i_2;
  int iVar;
  int iVarReused;
  int local_b4;
  ulong local_b0;
  int local_a4;
  uint *local_a0;
  uint *local_98;
  uint local_8c;
  uint *local_88;
  uint *local_80;
  uint local_74;
  Lpk_Man_t *local_70;
  uint *local_68;
  uint *local_60;
  uint *local_58;
  uint *local_50;
  uint *local_48;
  uint *local_40;
  If_Obj_t **local_38;
  
  iVar1 = p->vTtNodes->nSize;
  if ((((((iVar1 < 1) || (iVar1 == 1)) || (iVar1 < 3)) || ((iVar1 == 3 || (iVar1 < 5)))) ||
      ((iVar1 == 5 || ((iVar1 < 7 || (iVar1 == 7)))))) ||
     ((iVar1 < 9 || (((iVar1 == 9 || (iVar1 < 0xb)) || (local_38 = ppLeaves, iVar1 == 0xb)))))) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  uVar18 = (ulong)(uint)nVars;
  ppvVar2 = p->vTtNodes->pArray;
  puVar9 = (uint *)*ppvVar2;
  local_68 = (uint *)ppvVar2[1];
  puVar16 = (uint *)ppvVar2[2];
  puVar11 = (uint *)ppvVar2[3];
  local_60 = (uint *)ppvVar2[4];
  local_98 = (uint *)ppvVar2[5];
  local_a0 = (uint *)ppvVar2[6];
  local_58 = (uint *)ppvVar2[7];
  local_88 = (uint *)ppvVar2[8];
  local_48 = (uint *)ppvVar2[9];
  local_50 = (uint *)ppvVar2[10];
  local_40 = (uint *)ppvVar2[0xb];
  uVar4 = Lpk_MapSuppRedDecSelect(p,pTruth,nVars,&local_b4,&local_a4);
  if (uVar4 == 0) {
    return (If_Obj_t *)0x0;
  }
  p->nCalledSRed = p->nCalledSRed + 1;
  local_70 = p;
  Kit_TruthCofactor0New(puVar9,pTruth,nVars,local_b4);
  pTruth_00 = local_68;
  Kit_TruthCofactor1New(local_68,pTruth,nVars,local_b4);
  local_8c = uVar4 & 0xffff;
  local_80 = puVar9;
  pKVar5 = Kit_DsdDecompose(puVar9,nVars);
  pKVar6 = Kit_DsdDecompose(pTruth_00,nVars);
  pNtk = Kit_DsdExpand(pKVar5);
  Kit_DsdNtkFree(pKVar5);
  pKVar5 = Kit_DsdExpand(pKVar6);
  Kit_DsdNtkFree(pKVar6);
  pLVar3 = local_70;
  Kit_DsdTruthPartial(local_70->pDsdMan,pNtk,puVar16,local_8c);
  Kit_DsdTruthPartial(pLVar3->pDsdMan,pKVar5,puVar11,(int)uVar4 >> 0x10);
  Kit_DsdNtkFree(pNtk);
  Kit_DsdNtkFree(pKVar5);
  Kit_TruthMuxVar(local_60,puVar16,puVar11,nVars,local_b4);
  uVar13 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar13 = 1;
  }
  local_74 = 0xffffffff;
  uVar14 = (ulong)uVar13;
  uVar10 = 0xffffffff;
  if (0 < (int)uVar13) {
    lVar7 = 0;
    puVar9 = puVar16;
    do {
      if (*puVar9 != 0) {
        uVar10 = 0;
        goto LAB_004e06d1;
      }
      lVar7 = lVar7 + -0x20;
      puVar9 = puVar9 + 1;
    } while (uVar14 * 0x20 + lVar7 != 0);
    uVar10 = 0xffffffff;
  }
  goto LAB_004e06e9;
  while (local_74 = local_74 + 1, local_74 != 0x20) {
LAB_004e0716:
    if ((*puVar9 >> (local_74 & 0x1f) & 1) != 0) goto LAB_004e0727;
  }
  local_74 = 0xffffffff;
LAB_004e0727:
  local_74 = local_74 - (int)lVar7;
  goto LAB_004e0729;
  while (uVar17 = uVar17 + 1, uVar17 != 0x20) {
LAB_004e0779:
    if ((*puVar16 >> (uVar17 & 0x1f) & 1) == 0) goto LAB_004e078e;
  }
  uVar17 = 0xffffffff;
LAB_004e078e:
  uVar17 = uVar17 - (int)lVar7;
  goto LAB_004e0791;
  while (uVar12 = uVar12 + 1, uVar12 != 0x20) {
LAB_004e07de:
    if ((*puVar11 >> (uVar12 & 0x1f) & 1) == 0) goto LAB_004e07ef;
  }
  uVar12 = 0xffffffff;
LAB_004e07ef:
  uVar12 = uVar12 - (int)lVar7;
  goto LAB_004e07f1;
  while (uVar10 = uVar10 + 1, uVar10 != 0x20) {
LAB_004e06d1:
    if ((*puVar9 >> (uVar10 & 0x1f) & 1) != 0) goto LAB_004e06e6;
  }
  uVar10 = 0xffffffff;
LAB_004e06e6:
  uVar10 = uVar10 - (int)lVar7;
LAB_004e06e9:
  if (0 < (int)uVar13) {
    lVar7 = 0;
    puVar9 = puVar11;
    do {
      if (*puVar9 != 0) {
        local_74 = 0;
        goto LAB_004e0716;
      }
      lVar7 = lVar7 + -0x20;
      puVar9 = puVar9 + 1;
    } while (uVar14 * 0x20 + lVar7 != 0);
  }
LAB_004e0729:
  local_b0 = uVar18;
  if (((int)uVar10 < 0) || ((int)local_74 < 0)) {
    __assert_fail("TrueMint0 >= 0 && TrueMint1 >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMux.c"
                  ,0xb9,
                  "If_Obj_t *Lpk_MapSuppRedDec_rec(Lpk_Man_t *, unsigned int *, int, If_Obj_t **)");
  }
  uVar12 = 0xffffffff;
  uVar17 = 0xffffffff;
  if (0 < (int)uVar13) {
    lVar7 = 0;
    do {
      if (*puVar16 != 0xffffffff) {
        uVar17 = 0;
        goto LAB_004e0779;
      }
      lVar7 = lVar7 + -0x20;
      puVar16 = puVar16 + 1;
    } while (uVar14 * 0x20 + lVar7 != 0);
    uVar17 = 0xffffffff;
  }
LAB_004e0791:
  if (0 < (int)uVar13) {
    lVar7 = 0;
    do {
      if (*puVar11 != 0xffffffff) {
        uVar12 = 0;
        goto LAB_004e07de;
      }
      lVar7 = lVar7 + -0x20;
      puVar11 = puVar11 + 1;
    } while (uVar14 * 0x20 + lVar7 != 0);
  }
LAB_004e07f1:
  if ((-1 < (int)uVar17) && (-1 < (int)uVar12)) {
    if (0 < (int)uVar13) {
      lVar7 = uVar14 + 1;
      do {
        local_98[lVar7 + -2] = local_80[lVar7 + -2];
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
      if (0 < (int)uVar13) {
        lVar7 = uVar14 + 1;
        do {
          local_a0[lVar7 + -2] = local_80[lVar7 + -2];
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
      }
    }
    if (0 < nVars) {
      iVar_00 = 0;
      do {
        uVar15 = 1 << ((byte)iVar_00 & 0x1f);
        if ((local_8c >> (iVar_00 & 0x1f) & 1) != 0) {
          if ((uVar15 & uVar17) == 0) {
            Kit_TruthCofactor0(local_98,(int)local_b0,iVar_00);
          }
          else {
            Kit_TruthCofactor1(local_98,(int)local_b0,iVar_00);
          }
          if ((uVar15 & uVar10) == 0) {
            Kit_TruthCofactor0(local_a0,(int)local_b0,iVar_00);
          }
          else {
            Kit_TruthCofactor1(local_a0,(int)local_b0,iVar_00);
          }
        }
        iVar_00 = iVar_00 + 1;
      } while ((uint)local_b0 != iVar_00);
    }
    puVar9 = local_58;
    pLVar3 = local_70;
    if (0 < (int)uVar13) {
      lVar7 = uVar14 + 1;
      do {
        local_58[lVar7 + -2] = local_68[lVar7 + -2];
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
      if (0 < (int)uVar13) {
        lVar7 = uVar14 + 1;
        do {
          local_88[lVar7 + -2] = local_68[lVar7 + -2];
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
      }
    }
    uVar13 = (uint)local_b0;
    if (0 < (int)uVar13) {
      uVar10 = 0;
      do {
        uVar17 = 1 << ((byte)uVar10 & 0x1f);
        if (((uint)((int)uVar4 >> 0x10) >> (uVar10 & 0x1f) & 1) != 0) {
          if ((uVar17 & uVar12) == 0) {
            Kit_TruthCofactor0(puVar9,uVar13,uVar10);
          }
          else {
            Kit_TruthCofactor1(puVar9,uVar13,uVar10);
          }
          if ((local_74 & uVar17) == 0) {
            Kit_TruthCofactor0(local_88,uVar13,uVar10);
          }
          else {
            Kit_TruthCofactor1(local_88,uVar13,uVar10);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
    }
    puVar11 = local_48;
    Kit_TruthMuxVar(local_48,local_98,local_a0,uVar13,local_a4);
    puVar16 = local_50;
    Kit_TruthMuxVar(local_50,puVar9,local_88,uVar13,local_a4);
    puVar9 = local_40;
    Kit_TruthMuxVar(local_40,puVar11,puVar16,uVar13,local_b4);
    pKVar5 = Kit_DsdDecompose(local_60,uVar13);
    pKVar6 = Kit_DsdDecompose(puVar9,uVar13);
    ppLeaves_00 = local_38;
    pIVar8 = Lpk_MapTree_rec(pLVar3,pKVar5,local_38,(uint)pKVar5->Root,(If_Obj_t *)0x0);
    ppLeaves_00[local_a4] = pIVar8;
    pIVar8 = Lpk_MapTree_rec(pLVar3,pKVar6,ppLeaves_00,(uint)pKVar6->Root,(If_Obj_t *)0x0);
    Kit_DsdNtkFree(pKVar5);
    Kit_DsdNtkFree(pKVar6);
    return pIVar8;
  }
  __assert_fail("FalseMint0 >= 0 && FalseMint1 >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkMux.c"
                ,0xbd,
                "If_Obj_t *Lpk_MapSuppRedDec_rec(Lpk_Man_t *, unsigned int *, int, If_Obj_t **)");
}

Assistant:

If_Obj_t * Lpk_MapSuppRedDec_rec( Lpk_Man_t * p, unsigned * pTruth, int nVars, If_Obj_t ** ppLeaves )
{
    Kit_DsdNtk_t * pNtkDec, * pNtkComp, * ppNtks[2], * pTemp;
    If_Obj_t * pObjNew;
    unsigned * pCof0 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  0 );
    unsigned * pCof1 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  1 );
    unsigned * pDec0 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  2 );
    unsigned * pDec1 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  3 );
    unsigned * pDec  = (unsigned *)Vec_PtrEntry( p->vTtNodes,  4 );
    unsigned * pCo00 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  5 );
    unsigned * pCo01 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  6 );
    unsigned * pCo10 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  7 );
    unsigned * pCo11 = (unsigned *)Vec_PtrEntry( p->vTtNodes,  8 );
    unsigned * pCo0  = (unsigned *)Vec_PtrEntry( p->vTtNodes,  9 );
    unsigned * pCo1  = (unsigned *)Vec_PtrEntry( p->vTtNodes, 10 );
    unsigned * pCo   = (unsigned *)Vec_PtrEntry( p->vTtNodes, 11 );
    int TrueMint0, TrueMint1, FalseMint0, FalseMint1;
    int uSubsets, uSubset0, uSubset1, iVar, iVarReused, i;

    // determine if supp-red decomposition exists
    uSubsets = Lpk_MapSuppRedDecSelect( p, pTruth, nVars, &iVar, &iVarReused );
    if ( uSubsets == 0 )
        return NULL;
    p->nCalledSRed++;

    // get the cofactors
    Kit_TruthCofactor0New( pCof0, pTruth, nVars, iVar );
    Kit_TruthCofactor1New( pCof1, pTruth, nVars, iVar );

    // get the bound sets
    uSubset0 = uSubsets & 0xFFFF;
    uSubset1 = uSubsets >> 16;

    // compute the decomposed functions
    ppNtks[0] = Kit_DsdDecompose( pCof0, nVars );
    ppNtks[1] = Kit_DsdDecompose( pCof1, nVars );
    ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );      Kit_DsdNtkFree( pTemp );
    ppNtks[1] = Kit_DsdExpand( pTemp = ppNtks[1] );      Kit_DsdNtkFree( pTemp );
    Kit_DsdTruthPartial( p->pDsdMan, ppNtks[0], pDec0, uSubset0 );
    Kit_DsdTruthPartial( p->pDsdMan, ppNtks[1], pDec1, uSubset1 );
//    Kit_DsdTruthPartialTwo( p->pDsdMan, ppNtks[0], uSubset0, iVarReused, pCo0, pDec0 );
//    Kit_DsdTruthPartialTwo( p->pDsdMan, ppNtks[1], uSubset1, iVarReused, pCo1, pDec1 );
    Kit_DsdNtkFree( ppNtks[0] );
    Kit_DsdNtkFree( ppNtks[1] );
//Kit_DsdPrintFromTruth( pDec0, nVars );
//Kit_DsdPrintFromTruth( pDec1, nVars );
    // get the decomposed function
    Kit_TruthMuxVar( pDec, pDec0, pDec1, nVars, iVar );

    // find any true assignments of the decomposed functions
    TrueMint0 = Kit_TruthFindFirstBit( pDec0, nVars );
    TrueMint1 = Kit_TruthFindFirstBit( pDec1, nVars );
    assert( TrueMint0 >= 0 && TrueMint1 >= 0 );
    // find any false assignments of the decomposed functions
    FalseMint0 = Kit_TruthFindFirstZero( pDec0, nVars );
    FalseMint1 = Kit_TruthFindFirstZero( pDec1, nVars );
    assert( FalseMint0 >= 0 && FalseMint1 >= 0 );

    // cofactor the cofactors according to these minterms
    Kit_TruthCopy( pCo00, pCof0, nVars );
    Kit_TruthCopy( pCo01, pCof0, nVars );
    for ( i = 0; i < nVars; i++ )
        if ( uSubset0 & (1 << i) )
        {
            if ( FalseMint0 & (1 << i) )
                Kit_TruthCofactor1( pCo00, nVars, i );
            else
                Kit_TruthCofactor0( pCo00, nVars, i );
            if ( TrueMint0 & (1 << i) )
                Kit_TruthCofactor1( pCo01, nVars, i );
            else
                Kit_TruthCofactor0( pCo01, nVars, i );
        }
    Kit_TruthCopy( pCo10, pCof1, nVars );
    Kit_TruthCopy( pCo11, pCof1, nVars );
    for ( i = 0; i < nVars; i++ )
        if ( uSubset1 & (1 << i) )
        {
            if ( FalseMint1 & (1 << i) )
                Kit_TruthCofactor1( pCo10, nVars, i );
            else
                Kit_TruthCofactor0( pCo10, nVars, i );
            if ( TrueMint1 & (1 << i) )
                Kit_TruthCofactor1( pCo11, nVars, i );
            else
                Kit_TruthCofactor0( pCo11, nVars, i );
        }

    // derive the functions by composing them with the new variable (iVarReused)
    Kit_TruthMuxVar( pCo0, pCo00, pCo01, nVars, iVarReused );
    Kit_TruthMuxVar( pCo1, pCo10, pCo11, nVars, iVarReused );
//Kit_DsdPrintFromTruth( pCo0, nVars );
//Kit_DsdPrintFromTruth( pCo1, nVars );

    // derive the composition function
    Kit_TruthMuxVar( pCo , pCo0 , pCo1 , nVars, iVar );

    // process the decomposed function
    pNtkDec = Kit_DsdDecompose( pDec, nVars );
    pNtkComp = Kit_DsdDecompose( pCo, nVars );
//Kit_DsdPrint( stdout, pNtkDec );
//Kit_DsdPrint( stdout, pNtkComp );
//printf( "cofactored variable %c\n", 'a' + iVar );
//printf( "reused variable %c\n", 'a' + iVarReused );

    ppLeaves[iVarReused] = Lpk_MapTree_rec( p, pNtkDec, ppLeaves, pNtkDec->Root, NULL );
    pObjNew = Lpk_MapTree_rec( p, pNtkComp, ppLeaves, pNtkComp->Root, NULL );

    Kit_DsdNtkFree( pNtkDec );
    Kit_DsdNtkFree( pNtkComp );
    return pObjNew;
}